

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# intercept.cpp
# Opt level: O0

void __thiscall
CLIntercept::createCommandQueuePropertiesOverride
          (CLIntercept *this,cl_device_id device,cl_queue_properties *properties,
          cl_queue_properties **pLocalQueueProperties)

{
  undefined1 auVar1 [16];
  SConfig *pSVar2;
  ulong uVar3;
  void *pvVar4;
  CLIntercept *in_RCX;
  long in_RDX;
  CLIntercept *in_RDI;
  cl_command_queue_properties props_1;
  cl_command_queue_properties props;
  size_t numProperties;
  bool addThrottleHintEnum;
  bool addPriorityHintEnum;
  bool addCommandQueuePropertiesEnum;
  cl_command_queue_properties *in_stack_ffffffffffffff88;
  CLIntercept *in_stack_ffffffffffffff90;
  bool local_61;
  bool local_51;
  bool local_42;
  bool local_41;
  undefined8 local_40;
  bool local_31;
  char *in_stack_ffffffffffffffd0;
  long lVar5;
  undefined5 in_stack_ffffffffffffffd8;
  undefined1 in_stack_ffffffffffffffdd;
  undefined1 in_stack_ffffffffffffffde;
  byte bVar6;
  
  bVar6 = 1;
  pSVar2 = config(in_RDI);
  local_51 = false;
  if (pSVar2->DefaultQueuePriorityHint != 0) {
    local_51 = checkDeviceForExtension
                         (in_RCX,(cl_device_id)
                                 CONCAT17(bVar6,CONCAT16(in_stack_ffffffffffffffde,
                                                         CONCAT15(in_stack_ffffffffffffffdd,
                                                                  in_stack_ffffffffffffffd8))),
                          in_stack_ffffffffffffffd0);
  }
  pSVar2 = config(in_RDI);
  local_61 = false;
  if (pSVar2->DefaultQueueThrottleHint != 0) {
    local_61 = checkDeviceForExtension
                         (in_RCX,(cl_device_id)
                                 CONCAT17(bVar6,CONCAT16(local_51,CONCAT15(in_stack_ffffffffffffffdd
                                                                           ,
                                                  in_stack_ffffffffffffffd8))),
                          in_stack_ffffffffffffffd0);
  }
  lVar5 = 0;
  if (in_RDX != 0) {
    for (; *(long *)(in_RDX + lVar5 * 8) != 0; lVar5 = lVar5 + 2) {
      in_stack_ffffffffffffff90 = *(CLIntercept **)(in_RDX + lVar5 * 8);
      if (in_stack_ffffffffffffff90 == (CLIntercept *)0x1093) {
        bVar6 = 0;
      }
      else if (in_stack_ffffffffffffff90 == (CLIntercept *)0x1096) {
        local_51 = false;
      }
      else if (in_stack_ffffffffffffff90 == (CLIntercept *)0x1097) {
        local_61 = false;
      }
    }
  }
  if ((bVar6 & 1) != 0) {
    lVar5 = lVar5 + 2;
  }
  if (local_61 != false) {
    lVar5 = lVar5 + 4;
  }
  auVar1._8_8_ = 0;
  auVar1._0_8_ = lVar5 + 1;
  uVar3 = SUB168(auVar1 * ZEXT816(8),0);
  if (SUB168(auVar1 * ZEXT816(8),8) != 0) {
    uVar3 = 0xffffffffffffffff;
  }
  pvVar4 = operator_new__(uVar3);
  in_RCX->m_ProcessId = (uint64_t)pvVar4;
  if (in_RCX->m_ProcessId != 0) {
    lVar5 = 0;
    if (in_RDX != 0) {
      for (; *(long *)(in_RDX + lVar5 * 8) != 0; lVar5 = lVar5 + 2) {
        *(undefined8 *)(in_RCX->m_ProcessId + lVar5 * 8) = *(undefined8 *)(in_RDX + lVar5 * 8);
        if (*(long *)(in_RDX + lVar5 * 8) == 0x1093) {
          local_31 = (bVar6 & 1) == 0;
          std::_Swallow_assign::operator=((_Swallow_assign *)&std::ignore,&local_31);
          local_40 = *(undefined8 *)(in_RDX + 8 + lVar5 * 8);
          modifyCommandQueueProperties(in_stack_ffffffffffffff90,in_stack_ffffffffffffff88);
          *(undefined8 *)(in_RCX->m_ProcessId + 8 + lVar5 * 8) = local_40;
        }
        else {
          *(undefined8 *)(in_RCX->m_ProcessId + 8 + lVar5 * 8) =
               *(undefined8 *)(in_RDX + 8 + lVar5 * 8);
        }
      }
    }
    if ((local_51 & 1U) != 0) {
      pSVar2 = config(in_RDI);
      local_41 = pSVar2->DefaultQueuePriorityHint != 0;
      std::_Swallow_assign::operator=((_Swallow_assign *)&std::ignore,&local_41);
      *(undefined8 *)(in_RCX->m_ProcessId + lVar5 * 8) = 0x1096;
      pSVar2 = config(in_RDI);
      *(ulong *)(in_RCX->m_ProcessId + 8 + lVar5 * 8) = (ulong)pSVar2->DefaultQueuePriorityHint;
      lVar5 = lVar5 + 2;
    }
    if ((local_61 & 1U) != 0) {
      pSVar2 = config(in_RDI);
      local_42 = pSVar2->DefaultQueueThrottleHint != 0;
      std::_Swallow_assign::operator=((_Swallow_assign *)&std::ignore,&local_42);
      *(undefined8 *)(in_RCX->m_ProcessId + lVar5 * 8) = 0x1097;
      pSVar2 = config(in_RDI);
      *(ulong *)(in_RCX->m_ProcessId + 8 + lVar5 * 8) = (ulong)pSVar2->DefaultQueueThrottleHint;
      lVar5 = lVar5 + 2;
    }
    if ((bVar6 & 1) != 0) {
      modifyCommandQueueProperties(in_stack_ffffffffffffff90,in_stack_ffffffffffffff88);
      *(undefined8 *)(in_RCX->m_ProcessId + lVar5 * 8) = 0x1093;
      *(undefined8 *)(in_RCX->m_ProcessId + 8 + lVar5 * 8) = 0;
      lVar5 = lVar5 + 2;
    }
    *(undefined8 *)(in_RCX->m_ProcessId + lVar5 * 8) = 0;
  }
  return;
}

Assistant:

void CLIntercept::createCommandQueuePropertiesOverride(
    cl_device_id device,
    const cl_queue_properties* properties,
    cl_queue_properties*& pLocalQueueProperties ) const
{
    // We're always going to add command queue properties, unless command queue
    // properties already exist (requesting the same property twice is an
    // error).  We also may add priority hints or throttle hints, in some cases.
    // So, look through the queue properties for these enums.  We need to do
    // this anyways to count the number of property pairs.
    bool    addCommandQueuePropertiesEnum = true;
    bool    addPriorityHintEnum =
                config().DefaultQueuePriorityHint != 0 &&
                checkDeviceForExtension( device, "cl_khr_priority_hints" );
    bool    addThrottleHintEnum =
                config().DefaultQueueThrottleHint != 0 &&
                checkDeviceForExtension( device, "cl_khr_throttle_hints" );

    size_t  numProperties = 0;
    if( properties )
    {
        while( properties[ numProperties ] != 0 )
        {
            switch( properties[ numProperties ] )
            {
            case CL_QUEUE_PROPERTIES:
                addCommandQueuePropertiesEnum = false;
                break;
            case CL_QUEUE_PRIORITY_KHR:
                addPriorityHintEnum = false;
                break;
            case CL_QUEUE_THROTTLE_KHR:
                addThrottleHintEnum = false;
                break;
            default:
                break;
            }
            numProperties += 2;
        }
    }

    if( addCommandQueuePropertiesEnum )
    {
        numProperties += 2;
    }
    if( addThrottleHintEnum )
    {
        numProperties += 2;
    }
    if( addThrottleHintEnum )
    {
        numProperties += 2;
    }

    // Allocate a new array of properties.  We need to allocate two
    // properties for each pair, plus one property for the terminating
    // zero.
    pLocalQueueProperties = new cl_queue_properties[ numProperties + 1 ];
    if( pLocalQueueProperties )
    {
        // Copy the old properties array to the new properties array,
        // if the new properties array exists.
        numProperties = 0;
        if( properties )
        {
            while( properties[ numProperties ] != 0 )
            {
                pLocalQueueProperties[ numProperties ] = properties[ numProperties ];
                if( properties[ numProperties ] == CL_QUEUE_PROPERTIES )
                {
                    CLI_ASSERT( addCommandQueuePropertiesEnum == false );

                    cl_command_queue_properties props = properties[ numProperties + 1 ];

                    modifyCommandQueueProperties( props );

                    pLocalQueueProperties[ numProperties + 1 ] = props;
                }
                else
                {
                    pLocalQueueProperties[ numProperties + 1 ] =
                        properties[ numProperties + 1 ];
                }
                numProperties += 2;
            }
        }
        if( addPriorityHintEnum )
        {
            CLI_ASSERT( config().DefaultQueuePriorityHint != 0 );
            pLocalQueueProperties[ numProperties] = CL_QUEUE_PRIORITY_KHR;
            pLocalQueueProperties[ numProperties + 1 ] = config().DefaultQueuePriorityHint;
            numProperties += 2;
        }
        if( addThrottleHintEnum )
        {
            CLI_ASSERT( config().DefaultQueueThrottleHint != 0 );
            pLocalQueueProperties[ numProperties] = CL_QUEUE_THROTTLE_KHR;
            pLocalQueueProperties[ numProperties + 1 ] = config().DefaultQueueThrottleHint;
            numProperties += 2;
        }

        // This setting is added last in the list, in order to better behave with runtimes
        // truncating it when a property has a value of 0, which may be the case below.
        if( addCommandQueuePropertiesEnum )
        {
            cl_command_queue_properties props = 0;

            modifyCommandQueueProperties(props);

            pLocalQueueProperties[numProperties] = CL_QUEUE_PROPERTIES;
            pLocalQueueProperties[numProperties + 1] = props;
            numProperties += 2;
        }

        // Add the terminating zero.
        pLocalQueueProperties[ numProperties ] = 0;
    }
}